

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

ALCenum __thiscall
anon_unknown.dwarf_254152::AlsaCapture::captureSamples
          (AlsaCapture *this,byte *buffer,ALCuint samples)

{
  RingBuffer *this_00;
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  undefined8 uVar4;
  pointer pbVar5;
  size_t __n;
  pointer pbVar6;
  ptrdiff_t _Num;
  long __n2;
  pointer __src;
  ulong uVar7;
  bool bVar8;
  uint local_3c;
  
  this_00 = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
            _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
            super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  if (this_00 == (RingBuffer *)0x0) {
    this->mLastAvail = this->mLastAvail - (long)(ulong)samples;
    bVar8 = samples != 0;
    local_3c = samples;
    if ((bVar8) && (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) != 0)) {
      do {
        uVar7 = (ulong)local_3c;
LAB_00162d26:
        pbVar6 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pbVar5 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pbVar6 != pbVar5) {
          uVar2 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                            (this->mPcmHandle,(long)pbVar5 - (long)pbVar6);
          if (uVar7 <= uVar2) {
            uVar2 = uVar7;
          }
          sVar3 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,uVar2);
          pbVar6 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((long)sVar3 < 1) {
            if (sVar3 != 0) goto LAB_00162d9a;
          }
          else {
            memmove(buffer,pbVar6,sVar3);
            pbVar6 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                     _M_impl.super__Vector_impl_data._M_start;
LAB_00162d9a:
            __src = pbVar6 + sVar3;
            __n = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)__src;
            pbVar5 = __src;
            if (__n != 0) {
              memmove(pbVar6,__src,__n);
              pbVar5 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            }
            if (pbVar5 != pbVar6 + ((long)pbVar5 - (long)__src)) {
              (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
              super__Vector_impl_data._M_finish = pbVar6 + ((long)pbVar5 - (long)__src);
            }
          }
          uVar2 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)(this->mPcmHandle,sVar3);
LAB_00162ddc:
          if (-1 < (long)uVar2) goto LAB_00162e56;
          if (0 < (int)gLogLevel) {
            _GLOBAL__N_1::AlsaCapture::captureSamples();
          }
          if (uVar2 != 0xfffffffffffffff5) {
            iVar1 = (*(anonymous_namespace)::psnd_pcm_recover)
                              (this->mPcmHandle,uVar2 & 0xffffffff,1);
            if ((iVar1 < 0) ||
               (iVar1 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle), iVar1 < 0)) {
              uVar2 = (ulong)iVar1;
            }
            else {
              uVar2 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
            }
            if ((long)uVar2 < 0) {
              uVar4 = (*(anonymous_namespace)::psnd_strerror)(uVar2 & 0xffffffff);
              if (0 < (int)gLogLevel) {
                fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
              }
              ALCdevice::handleDisconnect
                        ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar4);
              goto LAB_00162ed0;
            }
            if (uVar2 < uVar7) goto LAB_00162ed0;
          }
          if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & bVar8) == 0) break;
          goto LAB_00162d26;
        }
        if (this->mDoCapture == true) {
          uVar2 = (*(anonymous_namespace)::psnd_pcm_readi)(this->mPcmHandle,buffer,uVar7);
          goto LAB_00162ddc;
        }
        uVar2 = 0;
LAB_00162e56:
        buffer = buffer + uVar2;
        local_3c = local_3c - (int)uVar2;
        bVar8 = local_3c != 0;
      } while ((((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) != 0) &&
              (local_3c != 0));
    }
    if (local_3c != 0) {
LAB_00162ed0:
      sVar3 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,local_3c);
      if (0 < (long)sVar3) {
        memset(buffer,(uint)(((this->super_BackendBase).mDevice)->FmtType != DevFmtUByte) * 0x80 +
                      -0x80,sVar3);
      }
    }
  }
  else {
    RingBuffer::read(this_00,(int)buffer,(void *)(ulong)samples,(ulong)samples);
  }
  return 0;
}

Assistant:

ALCenum AlsaCapture::captureSamples(al::byte *buffer, ALCuint samples)
{
    if(mRing)
    {
        mRing->read(buffer, samples);
        return ALC_NO_ERROR;
    }

    mLastAvail -= samples;
    while(mDevice->Connected.load(std::memory_order_acquire) && samples > 0)
    {
        snd_pcm_sframes_t amt{0};

        if(!mBuffer.empty())
        {
            /* First get any data stored from the last stop */
            amt = snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
            if(static_cast<snd_pcm_uframes_t>(amt) > samples) amt = samples;

            amt = snd_pcm_frames_to_bytes(mPcmHandle, amt);
            std::copy_n(mBuffer.begin(), amt, buffer);

            mBuffer.erase(mBuffer.begin(), mBuffer.begin()+amt);
            amt = snd_pcm_bytes_to_frames(mPcmHandle, amt);
        }
        else if(mDoCapture)
            amt = snd_pcm_readi(mPcmHandle, buffer, samples);
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            /* If the amount available is less than what's asked, we lost it
             * during recovery. So just give silence instead. */
            if(static_cast<snd_pcm_uframes_t>(amt) < samples)
                break;
            continue;
        }

        buffer = buffer + amt;
        samples -= static_cast<ALCuint>(amt);
    }
    if(samples > 0)
        std::fill_n(buffer, snd_pcm_frames_to_bytes(mPcmHandle, samples),
            al::byte((mDevice->FmtType == DevFmtUByte) ? 0x80 : 0));

    return ALC_NO_ERROR;
}